

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

bool __thiscall
duckdb::BinaryLambdaWrapper::
Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
          (BinaryLambdaWrapper *this,anon_class_16_2_9a274d3c fun,string_t left,string_t right,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  pointer this_00;
  long lVar2;
  ValidityMask *pVVar3;
  undefined1 local_80 [8];
  ValidityMask *local_78;
  undefined8 local_70;
  long local_68;
  string local_60;
  string local_40;
  
  local_80 = left.value._8_8_;
  local_68 = left.value._0_8_;
  local_70 = fun.context;
  local_78 = mask;
  this_00 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
            ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                          *)this);
  lVar2 = local_68;
  if (((ulong)local_70 & 0xffffffff) < 0xd) {
    lVar2 = (long)&local_70 + 4;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,lVar2,((ulong)local_70 & 0xffffffff) + lVar2);
  pVVar3 = local_78;
  if (((ulong)local_80 & 0xffffffff) < 0xd) {
    pVVar3 = (ValidityMask *)(local_80 + 4);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pVVar3,
             (undefined1 *)
             ((long)&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask +
             ((ulong)local_80 & 0xffffffff)));
  bVar1 = CatalogSearchPath::SchemaInSearchPath
                    (this_00,(ClientContext *)fun.search_path,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}